

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TUDPTransportTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::testutils::TUDPTransport_testUDPTransport_Test::TestBody
          (TUDPTransport_testUDPTransport_Test *this)

{
  bool bVar1;
  uint32_t len;
  char *pcVar2;
  reference pvVar3;
  int *val1;
  int __oflag;
  int __fd;
  IPAddress *addr;
  AssertHelper local_4e0 [8];
  Message local_4d8 [12];
  int local_4cc;
  undefined1 local_4c8 [8];
  AssertionResult gtest_ar;
  undefined1 local_4b0 [4];
  uint32_t numRead;
  array<unsigned_char,_256UL> buffer;
  string local_328 [32];
  thread local_308;
  thread clientThread;
  IPAddress serverAddr;
  AssertionResult local_270 [2];
  AssertHelper local_250 [8];
  Message local_248 [15];
  bool local_239;
  undefined1 local_238 [8];
  AssertionResult gtest_ar_;
  string local_220;
  IPAddress local_200;
  undefined1 local_178 [8];
  TUDPTransport server;
  allocator local_31;
  string local_30 [8];
  string message;
  TUDPTransport_testUDPTransport_Test *this_local;
  
  message.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"test",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_220,"127.0.0.1",(allocator *)((long)&gtest_ar_.message_.ptr_ + 7));
  net::IPAddress::v4(&local_200,&local_220,0);
  addr = &local_200;
  TUDPTransport::TUDPTransport((TUDPTransport *)local_178,addr);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  TUDPTransport::open((TUDPTransport *)local_178,(char *)addr,__oflag);
  local_239 = TUDPTransport::isOpen((TUDPTransport *)local_178);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_238,&local_239,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar1) {
    testing::Message::Message(local_248);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_270,local_238,"server.isOpen()","false");
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_250,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/testutils/TUDPTransportTest.cpp"
               ,0x2c,pcVar2);
    testing::internal::AssertHelper::operator=(local_250,local_248);
    testing::internal::AssertHelper::~AssertHelper(local_250);
    std::__cxx11::string::~string((string *)local_270);
    testing::Message::~Message(local_248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  if (bVar1) {
    TUDPTransport::addr((IPAddress *)&clientThread,(TUDPTransport *)local_178);
    memcpy(buffer._M_elems + 0xf8,&clientThread,0x84);
    std::__cxx11::string::string(local_328,local_30);
    std::thread::
    thread<jaegertracing::testutils::TUDPTransport_testUDPTransport_Test::TestBody()::__0,,void>
              (&local_308,(type *)(buffer._M_elems + 0xf8));
    TestBody()::$_0::~__0((__0 *)(buffer._M_elems + 0xf8));
    pvVar3 = std::array<unsigned_char,_256UL>::operator[]
                       ((array<unsigned_char,_256UL> *)local_4b0,0);
    len = std::__cxx11::string::size();
    gtest_ar.message_.ptr_._4_4_ =
         apache::thrift::transport::
         TVirtualTransport<jaegertracing::testutils::TUDPTransport,_apache::thrift::transport::TTransportDefaults>
         ::readAll((TVirtualTransport<jaegertracing::testutils::TUDPTransport,_apache::thrift::transport::TTransportDefaults>
                    *)local_178,pvVar3,len);
    local_4cc = 0;
    val1 = &local_4cc;
    testing::internal::CmpHelperLT<int,unsigned_int>
              ((internal *)local_4c8,"0","numRead",val1,(uint *)((long)&gtest_ar.message_.ptr_ + 4))
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c8);
    if (!bVar1) {
      testing::Message::Message(local_4d8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4c8);
      val1 = (int *)0x47;
      testing::internal::AssertHelper::AssertHelper
                (local_4e0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/testutils/TUDPTransportTest.cpp"
                 ,0x47,pcVar2);
      testing::internal::AssertHelper::operator=(local_4e0,local_4d8);
      testing::internal::AssertHelper::~AssertHelper(local_4e0);
      testing::Message::~Message(local_4d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c8);
    if (bVar1) {
      pvVar3 = std::array<unsigned_char,_256UL>::operator[]
                         ((array<unsigned_char,_256UL> *)local_4b0,0);
      __fd = (int)pvVar3;
      TUDPTransport::write
                ((TUDPTransport *)local_178,__fd,(void *)(ulong)gtest_ar.message_.ptr_._4_4_,
                 (size_t)val1);
      std::thread::join();
      TUDPTransport::close((TUDPTransport *)local_178,__fd);
    }
    std::thread::~thread(&local_308);
  }
  TUDPTransport::~TUDPTransport((TUDPTransport *)local_178);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST(TUDPTransport, testUDPTransport)
{
    const std::string message("test");

    TUDPTransport server(net::IPAddress::v4("127.0.0.1", 0));
    server.open();  // Not necessary. Just making sure this is called.
    ASSERT_TRUE(server.isOpen());

    const auto serverAddr = server.addr();
    std::thread clientThread([serverAddr, message]() {
        net::Socket connUDP;
        connUDP.open(AF_INET, SOCK_DGRAM);
        const auto numWritten =
            ::sendto(connUDP.handle(),
                     message.c_str(),
                     message.size(),
                     0,
                     reinterpret_cast<const ::sockaddr*>(&serverAddr.addr()),
                     serverAddr.addrLen());
        ASSERT_EQ(numWritten, message.size());

        std::array<char, kBufferSize> buffer;
        const auto numRead = ::recvfrom(
            connUDP.handle(), &buffer[0], buffer.size(), 0, nullptr, 0);
        const std::string received(&buffer[0], &buffer[numRead]);
        ASSERT_EQ(message.size(), numRead);
        ASSERT_EQ(message, received);

        connUDP.close();
    });

    std::array<uint8_t, kBufferSize> buffer;
    const auto numRead = server.readAll(&buffer[0], message.size());
    ASSERT_LT(0, numRead);
    server.write(&buffer[0], numRead);

    clientThread.join();
    server.close();
}